

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::relative_path(path *this)

{
  bool bVar1;
  size_type sVar2;
  path *in_RSI;
  path *in_RDI;
  size_type rootPathLen;
  path *this_00;
  format fmt;
  string_type *source;
  path *in_stack_ffffffffffffffb0;
  unsigned_long local_40;
  string_type local_38;
  unsigned_long local_18 [3];
  
  this_00 = in_RDI;
  sVar2 = root_name_length(in_RSI);
  bVar1 = has_root_directory(this_00);
  fmt = (format)((ulong)this_00 >> 0x20);
  local_18[0] = sVar2 + bVar1;
  local_40 = std::__cxx11::string::length();
  std::min<unsigned_long>(local_18,&local_40);
  source = &local_38;
  std::__cxx11::string::substr((ulong)source,(ulong)in_RSI);
  path(in_stack_ffffffffffffffb0,source,fmt);
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return path(_path.substr((std::min)(rootPathLen, _path.length())), generic_format);
}